

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> __thiscall
flatbuffers::FlatCompiler::GenerateCode
          (FlatCompiler *this,FlatCOptions *options,Parser *conform_parser)

{
  bool bVar1;
  SizeT SVar2;
  uint uVar3;
  int iVar4;
  Parser *this_00;
  flatbuffers *this_01;
  _Base_ptr p_Var5;
  ulong uVar6;
  char *pcVar7;
  pointer pPVar8;
  uint8_t *puVar9;
  size_t size_00;
  long lVar10;
  void *buf;
  size_t sVar11;
  size_t sVar12;
  size_type *this_02;
  element_type *peVar13;
  type pPVar14;
  undefined8 uVar15;
  Parser *in_RCX;
  _Base_ptr p_Var16;
  Parser *pPVar17;
  bool bVar18;
  Reference RVar19;
  bool local_992;
  allocator<char> local_959;
  string local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  int local_894;
  undefined1 local_890 [4];
  Status status_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  int local_72c;
  undefined1 local_728 [4];
  Status status_1;
  CodeGenOptions code_gen_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  undefined1 local_698 [64];
  string local_658;
  int local_634;
  string local_630 [4];
  Status status;
  string make_rule;
  shared_ptr<flatbuffers::CodeGenerator> *code_generator;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
  *__range2;
  int64_t bfbs_length;
  uint8_t *bfbs_buffer;
  undefined1 local_5c0 [8];
  string filebase;
  undefined1 local_580 [8];
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  undefined1 local_510 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reuse_tracker;
  size_type size;
  uint8_t *data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_401;
  undefined1 local_400 [7];
  bool is_binary_schema;
  bool local_3d9;
  undefined1 local_3d8 [7];
  bool is_schema;
  string ext;
  undefined1 local_3a8 [7];
  bool is_binary;
  undefined1 local_388 [8];
  string contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  IDLOptions opts;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator file_it;
  Parser *conform_parser_local;
  FlatCOptions *options_local;
  FlatCompiler *this_local;
  unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *parser;
  
  pPVar17 = in_RCX;
  this_00 = (Parser *)operator_new(0x780);
  Parser::Parser(this_00,(IDLOptions *)conform_parser);
  std::unique_ptr<flatbuffers::Parser,std::default_delete<flatbuffers::Parser>>::
  unique_ptr<std::default_delete<flatbuffers::Parser>,void>
            ((unique_ptr<flatbuffers::Parser,std::default_delete<flatbuffers::Parser>> *)this,
             this_00);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent);
  while( true ) {
    opts._776_8_ = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&opts.grpc_python_typed_handlers);
    if (!bVar1) break;
    IDLOptions::IDLOptions((IDLOptions *)&filename,(IDLOptions *)conform_parser);
    contents.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&local_48);
    std::__cxx11::string::string((string *)local_388);
    this_01 = (flatbuffers *)std::__cxx11::string::c_str();
    bVar1 = LoadFile(this_01,(char *)0x1,SUB81((string *)local_388,0),(string *)pPVar17);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     "unable to load file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     contents.field_2._8_8_);
      Error((FlatCompiler *)options,(string *)local_3a8,true,true);
      std::__cxx11::string::~string((string *)local_3a8);
    }
    ext.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent);
    p_Var5 = (_Base_ptr)
             __gnu_cxx::operator-
                       (&local_48,
                        (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&ext.field_2 + 8));
    p_Var16 = (conform_parser->known_attributes_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_right;
    bVar18 = p_Var5 < p_Var16;
    GetExtension((string *)local_3d8,(string *)contents.field_2._8_8_);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3d8,"fbs");
    pPVar17 = (Parser *)CONCAT71((int7)((ulong)p_Var16 >> 8),bVar1);
    local_992 = true;
    if (!bVar1) {
      local_992 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3d8,"proto");
    }
    local_3d9 = local_992;
    if ((local_992 != false) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
      StripFileName((string *)local_400,(string *)contents.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&opts.no_warnings,(string *)local_400);
      std::__cxx11::string::~string((string *)local_400);
    }
    pcVar7 = reflection::SchemaExtension();
    local_401 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3d8,pcVar7);
    if (bVar18) {
      if (((filename._1_1_ & 1) == 0) && (!(bool)local_401)) {
        sVar11 = std::__cxx11::string::length();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        sVar12 = strlen(pcVar7);
        if (sVar11 != sVar12) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                         "input file appears to be binary: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         contents.field_2._8_8_);
          Error((FlatCompiler *)options,(string *)&data,true,true);
          std::__cxx11::string::~string((string *)&data);
        }
      }
      if (((local_3d9 & 1U) != 0) || ((local_401 & 1) != 0)) {
        pPVar17 = (Parser *)operator_new(0x780);
        Parser::Parser(pPVar17,(IDLOptions *)&filename);
        std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::reset
                  ((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
                   this,pPVar17);
      }
      if ((local_401 & 1) == 0) {
        if ((filename._1_1_ & 1) == 0) {
          pPVar14 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                    ::operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                                 *)this);
          pPVar17 = (Parser *)local_388;
          ParseFile((FlatCompiler *)options,pPVar14,(string *)contents.field_2._8_8_,
                    (string *)pPVar17,
                    (vector<const_char_*,_std::allocator<const_char_*>_> *)
                    &(conform_parser->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_parent);
          if ((local_3d9 & 1U) == 0) {
            pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                     ::operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                                   *)this);
            SVar2 = FlatBufferBuilderImpl<false>::GetSize(&pPVar8->builder_);
            if (SVar2 == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&err.field_2 + 8),
                             "input file is neither json nor a .fbs (schema) file: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             contents.field_2._8_8_);
              pPVar17 = (Parser *)0x1;
              Error((FlatCompiler *)options,(string *)((long)&err.field_2 + 8),true,true);
              std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
            }
          }
        }
        else if (opts._656_8_ == 0x80) {
          puVar9 = (uint8_t *)std::__cxx11::string::c_str();
          reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::size();
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_510);
          bVar1 = flexbuffers::VerifyBuffer
                            (puVar9,(size_t)reuse_tracker.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_510);
          if (!bVar1) {
            std::operator+(&local_530,"flexbuffers file failed to verify: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           contents.field_2._8_8_);
            Error((FlatCompiler *)options,&local_530,false,true);
            std::__cxx11::string::~string((string *)&local_530);
          }
          RVar19 = flexbuffers::GetRoot
                             (puVar9,(size_t)reuse_tracker.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pPVar17 = RVar19._8_8_;
          pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                   operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                               *)this);
          pPVar8->flex_root_ = RVar19;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_510);
        }
        else {
          pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                   operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                               *)this);
          flexbuffers::Builder::Clear(&pPVar8->flex_builder_);
          pPVar14 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                    ::operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                                 *)this);
          pPVar17 = (Parser *)local_388;
          ParseFile((FlatCompiler *)options,pPVar14,(string *)contents.field_2._8_8_,
                    (string *)pPVar17,
                    (vector<const_char_*,_std::allocator<const_char_*>_> *)
                    &(conform_parser->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_parent);
        }
      }
      else {
        pPVar14 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                  operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        pPVar17 = (Parser *)local_388;
        LoadBinarySchema((FlatCompiler *)options,pPVar14,(string *)contents.field_2._8_8_,
                         (string *)pPVar17);
      }
      if ((((local_3d9 & 1U) != 0) || ((local_401 & 1) != 0)) &&
         (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
        pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                 operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        Parser::ConformTo_abi_cxx11_((string *)local_580,pPVar8,in_RCX);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&filebase.field_2 + 8),"schemas don\'t conform: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_580);
          pPVar17 = (Parser *)0x1;
          Error((FlatCompiler *)options,(string *)((long)&filebase.field_2 + 8),false,true);
          std::__cxx11::string::~string((string *)(filebase.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)local_580);
      }
      if ((((conform_parser->opts).cpp_object_api_string_type.field_0x4 & 1) != 0) ||
         ((opts.include_prefix.field_2._M_local_buf[0xb] & 1U) != 0)) {
        pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                 operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        Parser::Serialize(pPVar8);
      }
      if (((conform_parser->opts).cpp_object_api_string_type.field_0x4 & 1) != 0) {
        pcVar7 = reflection::SchemaExtension();
        pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                 operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        std::__cxx11::string::operator=((string *)&pPVar8->file_extension_,pcVar7);
      }
    }
    else {
      pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
               operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                           *)this);
      FlatBufferBuilderImpl<false>::Clear(&pPVar8->builder_);
      pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
               operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                           *)this);
      puVar9 = (uint8_t *)std::__cxx11::string::c_str();
      size_00 = std::__cxx11::string::length();
      FlatBufferBuilderImpl<false>::PushFlatBuffer(&pPVar8->builder_,puVar9,size_00);
      if (((conform_parser->opts).cpp_object_api_string_type.field_0x3 & 1) == 0) {
        std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::operator->
                  ((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
                   this);
        lVar10 = std::__cxx11::string::length();
        if (lVar10 == 0) {
          std::operator+(&local_448,"current schema has no file_identifier: cannot test if \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         contents.field_2._8_8_);
          std::operator+(&local_428,&local_448,
                         "\" matches the schema, use --raw-binary to read this file anyway.");
          pPVar17 = (Parser *)0x1;
          Error((FlatCompiler *)options,&local_428,true,true);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
        }
        else {
          buf = (void *)std::__cxx11::string::c_str();
          std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
          operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> *)
                     this);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar1 = BufferHasIdentifier(buf,pcVar7,
                                      (bool)(opts.go_module_name.field_2._M_local_buf[9] & 1));
          if (!bVar1) {
            std::operator+(&local_4c8,"binary \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           contents.field_2._8_8_);
            std::operator+(&local_4a8,&local_4c8,"\" does not have expected file_identifier \"");
            pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                     ::operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                                   *)this);
            std::operator+(&local_488,&local_4a8,&pPVar8->file_identifier_);
            std::operator+(&local_468,&local_488,"\", use --raw-binary to read this file anyway.");
            pPVar17 = (Parser *)0x1;
            Error((FlatCompiler *)options,&local_468,true,true);
            std::__cxx11::string::~string((string *)&local_468);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4c8);
          }
        }
      }
    }
    StripExtension((string *)&bfbs_buffer,(string *)contents.field_2._8_8_);
    StripPath((string *)local_5c0,(string *)&bfbs_buffer);
    std::__cxx11::string::~string((string *)&bfbs_buffer);
    bfbs_length = 0;
    __range2 = (vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
                *)0x0;
    if (((conform_parser->opts).cpp_object_api_string_type.field_0x6 & 1) != 0) {
      pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
               operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                           *)this);
      Parser::Serialize(pPVar8);
      pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
               operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                           *)this);
      bfbs_length = (int64_t)FlatBufferBuilderImpl<false>::GetBufferPointer(&pPVar8->builder_);
      pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
               operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                           *)this);
      SVar2 = FlatBufferBuilderImpl<false>::GetSize(&pPVar8->builder_);
      __range2 = (vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
                  *)(ulong)SVar2;
    }
    this_02 = &(conform_parser->opts).cpp_object_api_string_type._M_string_length;
    __end2 = std::
             vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
             ::begin((vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
                      *)this_02);
    code_generator =
         (shared_ptr<flatbuffers::CodeGenerator> *)
         std::
         vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
         ::end((vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>
                *)this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<flatbuffers::CodeGenerator>_*,_std::vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                                       *)&code_generator), bVar1) {
      make_rule.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<flatbuffers::CodeGenerator>_*,_std::vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
           ::operator*(&__end2);
      if (((conform_parser->opts).cpp_object_api_string_type.field_0x2 & 1) == 0) {
        EnsureDirExists((string *)&(conform_parser->file_extension_).field_2);
        peVar13 = std::
                  __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)make_rule.field_2._8_8_);
        uVar3 = (*peVar13->_vptr_CodeGenerator[9])();
        if ((uVar3 & 1) == 0) {
          peVar13 = std::
                    __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)make_rule.field_2._8_8_);
          uVar3 = (*peVar13->_vptr_CodeGenerator[8])();
          if ((((uVar3 & 1) == 0) || ((local_3d9 & 1U) != 0)) || ((local_401 & 1) != 0)) {
            peVar13 = std::
                      __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)make_rule.field_2._8_8_);
            pPVar14 = std::
                      unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                      operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                                 *)this);
            pPVar17 = (Parser *)local_5c0;
            iVar4 = (*peVar13->_vptr_CodeGenerator[2])
                              (peVar13,pPVar14,&(conform_parser->file_extension_).field_2);
            if (iVar4 != 0) {
              peVar13 = std::
                        __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)make_rule.field_2._8_8_);
              (*peVar13->_vptr_CodeGenerator[0xc])(local_890);
              std::operator+(&local_870,"Unable to generate ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_890);
              std::operator+(&local_850,&local_870," for ");
              std::operator+(&local_830,&local_850,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_5c0);
              peVar13 = std::
                        __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)make_rule.field_2._8_8_);
              std::operator+(&local_810,&local_830,&peVar13->status_detail);
              pPVar17 = (Parser *)0x1;
              Error((FlatCompiler *)options,&local_810,true,true);
              std::__cxx11::string::~string((string *)&local_810);
              std::__cxx11::string::~string((string *)&local_830);
              std::__cxx11::string::~string((string *)&local_850);
              std::__cxx11::string::~string((string *)&local_870);
              std::__cxx11::string::~string((string *)local_890);
            }
          }
        }
        else {
          CodeGenOptions::CodeGenOptions((CodeGenOptions *)local_728);
          std::__cxx11::string::operator=
                    ((string *)local_728,
                     (string *)(conform_parser->file_extension_).field_2._M_local_buf);
          peVar13 = std::
                    __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)make_rule.field_2._8_8_);
          pPVar17 = (Parser *)local_728;
          local_72c = (*peVar13->_vptr_CodeGenerator[4])(peVar13,bfbs_length,__range2);
          if (local_72c != 0) {
            peVar13 = std::
                      __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)make_rule.field_2._8_8_);
            (*peVar13->_vptr_CodeGenerator[0xc])(&local_7f0);
            std::operator+(&local_7d0,"Unable to generate ",&local_7f0);
            std::operator+(&local_7b0,&local_7d0," for ");
            std::operator+(&local_790,&local_7b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5c0);
            peVar13 = std::
                      __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)make_rule.field_2._8_8_);
            std::operator+(&local_770,&local_790,&peVar13->status_detail);
            std::operator+(&local_750,&local_770," using bfbs generator.");
            pPVar17 = (Parser *)0x1;
            Error((FlatCompiler *)options,&local_750,true,true);
            std::__cxx11::string::~string((string *)&local_750);
            std::__cxx11::string::~string((string *)&local_770);
            std::__cxx11::string::~string((string *)&local_790);
            std::__cxx11::string::~string((string *)&local_7b0);
            std::__cxx11::string::~string((string *)&local_7d0);
            std::__cxx11::string::~string((string *)&local_7f0);
          }
          CodeGenOptions::~CodeGenOptions((CodeGenOptions *)local_728);
        }
      }
      else {
        std::__cxx11::string::string(local_630);
        peVar13 = std::
                  __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)make_rule.field_2._8_8_);
        pPVar14 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                  operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        local_634 = (*peVar13->_vptr_CodeGenerator[5])
                              (peVar13,pPVar14,&(conform_parser->file_extension_).field_2,
                               contents.field_2._8_8_,local_630);
        if ((local_634 == 0) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
          std::__cxx11::string::string((string *)(local_698 + 0x20),local_630);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_698," ",&local_699);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0," \\",&local_6c1);
          pPVar17 = (Parser *)local_698;
          WordWrap(&local_658,(string *)(local_698 + 0x20),0x50,(string *)pPVar17,&local_6c0);
          uVar15 = std::__cxx11::string::c_str();
          printf("%s\n",uVar15);
          std::__cxx11::string::~string((string *)&local_658);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::allocator<char>::~allocator(&local_6c1);
          std::__cxx11::string::~string((string *)local_698);
          std::allocator<char>::~allocator(&local_699);
          std::__cxx11::string::~string((string *)(local_698 + 0x20));
        }
        else {
          peVar13 = std::
                    __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)make_rule.field_2._8_8_);
          (*peVar13->_vptr_CodeGenerator[0xc])
                    ((undefined1 *)((long)&code_gen_options.output_path.field_2 + 8));
          std::operator+(&local_6e8,"Cannot generate make rule for ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&code_gen_options.output_path.field_2 + 8));
          pPVar17 = (Parser *)0x1;
          Error((FlatCompiler *)options,&local_6e8,true,true);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::__cxx11::string::~string
                    ((string *)(code_gen_options.output_path.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string(local_630);
      }
      if (((conform_parser->opts).cpp_object_api_string_type.field_0x5 & 1) != 0) {
        peVar13 = std::
                  __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)make_rule.field_2._8_8_);
        pPVar14 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                  operator*((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        pPVar17 = (Parser *)local_5c0;
        local_894 = (*peVar13->_vptr_CodeGenerator[6])
                              (peVar13,pPVar14,&(conform_parser->file_extension_).field_2);
        if (local_894 == 3) {
          peVar13 = std::
                    __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)make_rule.field_2._8_8_);
          (*peVar13->_vptr_CodeGenerator[0xc])(&local_8d8);
          std::operator+(&local_8b8,"GRPC interface generator not implemented for ",&local_8d8);
          Warn((FlatCompiler *)options,&local_8b8,true);
          std::__cxx11::string::~string((string *)&local_8b8);
          std::__cxx11::string::~string((string *)&local_8d8);
        }
        else if (local_894 == 1) {
          peVar13 = std::
                    __shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)make_rule.field_2._8_8_);
          (*peVar13->_vptr_CodeGenerator[0xc])(&local_918);
          std::operator+(&local_8f8,"Unable to generate GRPC interface for ",&local_918);
          pPVar17 = (Parser *)0x1;
          Error((FlatCompiler *)options,&local_8f8,true,true);
          std::__cxx11::string::~string((string *)&local_8f8);
          std::__cxx11::string::~string((string *)&local_918);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<flatbuffers::CodeGenerator>_*,_std::vector<std::shared_ptr<flatbuffers::CodeGenerator>,_std::allocator<std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
      ::operator++(&__end2);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
               operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                           *)this);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar1 = Parser::SetRootType(pPVar8,pcVar7);
      if (bVar1) {
        pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
                 operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                             *)this);
        if ((pPVar8->root_struct_def_->fixed & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"root type must be a table",&local_959);
          pPVar17 = (Parser *)0x1;
          Error((FlatCompiler *)options,&local_958,true,true);
          std::__cxx11::string::~string((string *)&local_958);
          std::allocator<char>::~allocator(&local_959);
        }
      }
      else {
        std::operator+(&local_938,"unknown root type: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &opts.protobuf_ascii_alike);
        pPVar17 = (Parser *)0x1;
        Error((FlatCompiler *)options,&local_938,true,true);
        std::__cxx11::string::~string((string *)&local_938);
      }
    }
    pPVar8 = std::unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::
             operator->((unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                         *)this);
    Parser::MarkGenerated(pPVar8);
    std::__cxx11::string::~string((string *)local_5c0);
    std::__cxx11::string::~string((string *)local_3d8);
    std::__cxx11::string::~string((string *)local_388);
    IDLOptions::~IDLOptions((IDLOptions *)&filename);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  return (__uniq_ptr_data<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>,_true,_true>
         )(__uniq_ptr_data<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Parser> FlatCompiler::GenerateCode(const FlatCOptions &options,
                                                   Parser &conform_parser) {
  std::unique_ptr<Parser> parser =
      std::unique_ptr<Parser>(new Parser(options.opts));

  for (auto file_it = options.filenames.begin();
       file_it != options.filenames.end(); ++file_it) {
    IDLOptions opts = options.opts;

    auto &filename = *file_it;
    std::string contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &contents))
      Error("unable to load file: " + filename);

    bool is_binary = static_cast<size_t>(file_it - options.filenames.begin()) >=
                     options.binary_files_from;
    auto ext = flatbuffers::GetExtension(filename);
    const bool is_schema = ext == "fbs" || ext == "proto";
    if (is_schema && opts.project_root.empty()) {
      opts.project_root = StripFileName(filename);
    }
    const bool is_binary_schema = ext == reflection::SchemaExtension();
    if (is_binary) {
      parser->builder_.Clear();
      parser->builder_.PushFlatBuffer(
          reinterpret_cast<const uint8_t *>(contents.c_str()),
          contents.length());
      if (!options.raw_binary) {
        // Generally reading binaries that do not correspond to the schema
        // will crash, and sadly there's no way around that when the binary
        // does not contain a file identifier.
        // We'd expect that typically any binary used as a file would have
        // such an identifier, so by default we require them to match.
        if (!parser->file_identifier_.length()) {
          Error("current schema has no file_identifier: cannot test if \"" +
                filename +
                "\" matches the schema, use --raw-binary to read this file"
                " anyway.");
        } else if (!flatbuffers::BufferHasIdentifier(
                       contents.c_str(), parser->file_identifier_.c_str(),
                       opts.size_prefixed)) {
          Error("binary \"" + filename +
                "\" does not have expected file_identifier \"" +
                parser->file_identifier_ +
                "\", use --raw-binary to read this file anyway.");
        }
      }
    } else {
      // Check if file contains 0 bytes.
      if (!opts.use_flexbuffers && !is_binary_schema &&
          contents.length() != strlen(contents.c_str())) {
        Error("input file appears to be binary: " + filename, true);
      }
      if (is_schema || is_binary_schema) {
        // If we're processing multiple schemas, make sure to start each
        // one from scratch. If it depends on previous schemas it must do
        // so explicitly using an include.
        parser.reset(new Parser(opts));
      }
      // Try to parse the file contents (binary schema/flexbuffer/textual
      // schema)
      if (is_binary_schema) {
        LoadBinarySchema(*parser, filename, contents);
      } else if (opts.use_flexbuffers) {
        if (opts.lang_to_generate == IDLOptions::kJson) {
          auto data = reinterpret_cast<const uint8_t *>(contents.c_str());
          auto size = contents.size();
          std::vector<uint8_t> reuse_tracker;
          if (!flexbuffers::VerifyBuffer(data, size, &reuse_tracker))
            Error("flexbuffers file failed to verify: " + filename, false);
          parser->flex_root_ = flexbuffers::GetRoot(data, size);
        } else {
          parser->flex_builder_.Clear();
          ParseFile(*parser, filename, contents, options.include_directories);
        }
      } else {
        ParseFile(*parser, filename, contents, options.include_directories);
        if (!is_schema && !parser->builder_.GetSize()) {
          // If a file doesn't end in .fbs, it must be json/binary. Ensure we
          // didn't just parse a schema with a different extension.
          Error("input file is neither json nor a .fbs (schema) file: " +
                    filename,
                true);
        }
      }
      if ((is_schema || is_binary_schema) &&
          !options.conform_to_schema.empty()) {
        auto err = parser->ConformTo(conform_parser);
        if (!err.empty()) Error("schemas don\'t conform: " + err, false);
      }
      if (options.schema_binary || opts.binary_schema_gen_embed) {
        parser->Serialize();
      }
      if (options.schema_binary) {
        parser->file_extension_ = reflection::SchemaExtension();
      }
    }
    std::string filebase =
        flatbuffers::StripPath(flatbuffers::StripExtension(filename));

    // If one of the generators uses bfbs, serialize the parser and get
    // the serialized buffer and length.
    const uint8_t *bfbs_buffer = nullptr;
    int64_t bfbs_length = 0;
    if (options.requires_bfbs) {
      parser->Serialize();
      bfbs_buffer = parser->builder_.GetBufferPointer();
      bfbs_length = parser->builder_.GetSize();
    }

    for (const std::shared_ptr<CodeGenerator> &code_generator :
         options.generators) {
      if (options.print_make_rules) {
        std::string make_rule;
        const CodeGenerator::Status status = code_generator->GenerateMakeRule(
            *parser, options.output_path, filename, make_rule);
        if (status == CodeGenerator::Status::OK && !make_rule.empty()) {
          printf("%s\n",
                 flatbuffers::WordWrap(make_rule, 80, " ", " \\").c_str());
        } else {
          Error("Cannot generate make rule for " +
                code_generator->LanguageName());
        }
      } else {
        flatbuffers::EnsureDirExists(options.output_path);

        // Prefer bfbs generators if present.
        if (code_generator->SupportsBfbsGeneration()) {
          CodeGenOptions code_gen_options;
          code_gen_options.output_path = options.output_path;

          const CodeGenerator::Status status = code_generator->GenerateCode(
              bfbs_buffer, bfbs_length, code_gen_options);
          if (status != CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail +
                  " using bfbs generator.");
          }
        } else {
          if ((!code_generator->IsSchemaOnly() ||
               (is_schema || is_binary_schema)) &&
              code_generator->GenerateCode(*parser, options.output_path,
                                           filebase) !=
                  CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail);
          }
        }
      }

      if (options.grpc_enabled) {
        const CodeGenerator::Status status = code_generator->GenerateGrpcCode(
            *parser, options.output_path, filebase);

        if (status == CodeGenerator::Status::NOT_IMPLEMENTED) {
          Warn("GRPC interface generator not implemented for " +
               code_generator->LanguageName());
        } else if (status == CodeGenerator::Status::ERROR) {
          Error("Unable to generate GRPC interface for " +
                code_generator->LanguageName());
        }
      }
    }

    if (!opts.root_type.empty()) {
      if (!parser->SetRootType(opts.root_type.c_str()))
        Error("unknown root type: " + opts.root_type);
      else if (parser->root_struct_def_->fixed)
        Error("root type must be a table");
    }

    // We do not want to generate code for the definitions in this file
    // in any files coming up next.
    parser->MarkGenerated();
  }

  return parser;
}